

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

char * mwGrabType(int type)

{
  char *pcStack_10;
  int type_local;
  
  if (type == 0xfb) {
    pcStack_10 = "grabbed";
  }
  else if (type == 0xfc) {
    pcStack_10 = "no-mans-land";
  }
  else {
    pcStack_10 = "<unknown type>";
  }
  return pcStack_10;
}

Assistant:

static const char *mwGrabType(int type)
{
	switch (type) {
		case MW_VAL_GRB:
			return "grabbed";
		case MW_VAL_NML:
			return "no-mans-land";
		default:
			/* do nothing */
			;
	}
	return "<unknown type>";
}